

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O1

ToolOptions * __thiscall
wasm::ToolOptions::addFeature
          (ToolOptions *this,Feature feature,string *description,FeatureSet impliedEnable,
          FeatureSet impliedDisable)

{
  undefined8 *puVar1;
  long *plVar2;
  string *psVar3;
  long *plVar4;
  Feature f;
  Feature f_00;
  ulong uVar5;
  undefined8 uVar6;
  ToolOptions *local_238;
  Feature FStack_230;
  FeatureSet FStack_22c;
  code *local_228;
  code *pcStack_220;
  ToolOptions *local_218;
  Feature FStack_210;
  uint32_t uStack_20c;
  code *local_208;
  code *pcStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158;
  long local_150;
  long local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  long *local_138 [2];
  long local_128 [2];
  string local_118;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long *local_58;
  undefined8 local_50;
  long local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  uint32_t local_38;
  Feature local_34;
  
  local_b8 = local_a8;
  local_38 = impliedDisable.features;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"--enable-","");
  FeatureSet::toString_abi_cxx11_(&local_118,(FeatureSet *)(ulong)feature,f);
  uVar5 = 0xf;
  if (local_b8 != local_a8) {
    uVar5 = local_a8[0];
  }
  if (uVar5 < local_118._M_string_length + local_b0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar6 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_118._M_string_length + local_b0) goto LAB_0011690d;
    puVar1 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_0011690d:
    puVar1 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_118._M_dataplus._M_p);
  }
  local_78 = &local_68;
  plVar2 = puVar1 + 2;
  if ((long *)*puVar1 == plVar2) {
    local_68 = *plVar2;
    uStack_60 = *(undefined4 *)(puVar1 + 3);
    uStack_5c = *(undefined4 *)((long)puVar1 + 0x1c);
  }
  else {
    local_68 = *plVar2;
    local_78 = (long *)*puVar1;
  }
  local_70 = puVar1[1];
  *puVar1 = plVar2;
  puVar1[1] = 0;
  *(undefined1 *)plVar2 = 0;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Enable ","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_198,(ulong)(description->_M_dataplus)._M_p);
  local_d8 = &local_c8;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_c8 = *plVar4;
    uStack_c0 = (undefined4)plVar2[3];
    uStack_bc = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_c8 = *plVar4;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Tool options","");
  _FStack_230 = CONCAT44(impliedEnable.features,feature);
  pcStack_220 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:223:12)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:223:12)>
              ::_M_manager;
  local_238 = this;
  local_34 = feature;
  psVar3 = (string *)
           wasm::Options::add((string *)&this->super_Options,(string *)&local_78,(string *)local_1b8
                              ,(string *)&local_d8,(Arguments)local_178,(function *)0x0,
                              SUB81(&local_238,0));
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"--disable-","");
  FeatureSet::toString_abi_cxx11_(&local_f8,(FeatureSet *)(ulong)local_34,f_00);
  uVar5 = 0xf;
  if (local_98 != local_88) {
    uVar5 = local_88[0];
  }
  if (uVar5 < local_f8._M_string_length + local_90) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar6 = local_f8.field_2._M_allocated_capacity;
    }
    if (local_f8._M_string_length + local_90 <= (ulong)uVar6) {
      puVar1 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_98);
      goto LAB_00116b47;
    }
  }
  puVar1 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_f8._M_dataplus._M_p);
LAB_00116b47:
  local_58 = &local_48;
  plVar2 = puVar1 + 2;
  if ((long *)*puVar1 == plVar2) {
    local_48 = *plVar2;
    uStack_40 = *(undefined4 *)(puVar1 + 3);
    uStack_3c = *(undefined4 *)((long)puVar1 + 0x1c);
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*puVar1;
  }
  local_50 = puVar1[1];
  *puVar1 = plVar2;
  puVar1[1] = 0;
  *(undefined1 *)plVar2 = 0;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Disable ","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_138,(ulong)(description->_M_dataplus)._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_148 = *plVar4;
    uStack_140 = (undefined4)plVar2[3];
    uStack_13c = *(undefined4 *)((long)plVar2 + 0x1c);
    local_158 = &local_148;
  }
  else {
    local_148 = *plVar4;
    local_158 = (long *)*plVar2;
  }
  local_150 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Tool options","");
  _FStack_210 = CONCAT44(local_38,local_34);
  pcStack_200 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:233:12)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:233:12)>
              ::_M_manager;
  local_218 = this;
  wasm::Options::add(psVar3,(string *)&local_58,(string *)local_1f8,(string *)&local_158,
                     (Arguments)local_1d8,(function *)0x0,SUB81(&local_218,0));
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,3);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,3);
  }
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_198[0] != local_188) {
    operator_delete(local_198[0],local_188[0] + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  return this;
}

Assistant:

ToolOptions& addFeature(FeatureSet::Feature feature,
                          const std::string& description,
                          FeatureSet impliedEnable = FeatureSet::None,
                          FeatureSet impliedDisable = FeatureSet::None) {
    (*this)
      .add(std::string("--enable-") + FeatureSet::toString(feature),
           "",
           std::string("Enable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature, impliedEnable](Options*, const std::string&) {
             enabledFeatures.set(feature | impliedEnable, true);
             disabledFeatures.set(feature | impliedEnable, false);
           })

      .add(std::string("--disable-") + FeatureSet::toString(feature),
           "",
           std::string("Disable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature, impliedDisable](Options*, const std::string&) {
             enabledFeatures.set(feature | impliedDisable, false);
             disabledFeatures.set(feature | impliedDisable, true);
           });
    return *this;
  }